

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

_Bool GPU_SaveSurface(SDL_Surface *surface,char *filename,GPU_FileFormatEnum format)

{
  void *data_00;
  int iVar1;
  char *s1;
  char *extension;
  uchar *data;
  _Bool result;
  GPU_FileFormatEnum format_local;
  char *filename_local;
  SDL_Surface *surface_local;
  
  if ((((surface == (SDL_Surface *)0x0) || (filename == (char *)0x0)) || (surface->w < 1)) ||
     (surface->h < 1)) {
    surface_local._7_1_ = false;
  }
  else {
    data_00 = surface->pixels;
    data._4_4_ = format;
    if (format == GPU_FILE_AUTO) {
      s1 = get_filename_ext(filename);
      iVar1 = gpu_strcasecmp(s1,"png");
      if (iVar1 == 0) {
        data._4_4_ = GPU_FILE_PNG;
      }
      else {
        iVar1 = gpu_strcasecmp(s1,"bmp");
        if (iVar1 == 0) {
          data._4_4_ = GPU_FILE_BMP;
        }
        else {
          iVar1 = gpu_strcasecmp(s1,"tga");
          if (iVar1 != 0) {
            GPU_PushErrorCode("GPU_SaveSurface",GPU_ERROR_DATA_ERROR,
                              "Could not detect output file format from file name");
            return false;
          }
          data._4_4_ = GPU_FILE_TGA;
        }
      }
    }
    if (data._4_4_ == GPU_FILE_PNG) {
      iVar1 = stbi_write_png(filename,surface->w,surface->h,(uint)surface->format->BytesPerPixel,
                             data_00,0);
      data._3_1_ = 0 < iVar1;
    }
    else if (data._4_4_ == GPU_FILE_BMP) {
      iVar1 = stbi_write_bmp(filename,surface->w,surface->h,(uint)surface->format->BytesPerPixel,
                             data_00);
      data._3_1_ = 0 < iVar1;
    }
    else if (data._4_4_ == GPU_FILE_TGA) {
      iVar1 = stbi_write_tga(filename,surface->w,surface->h,(uint)surface->format->BytesPerPixel,
                             data_00);
      data._3_1_ = 0 < iVar1;
    }
    else {
      GPU_PushErrorCode("GPU_SaveSurface",GPU_ERROR_DATA_ERROR,"Unsupported output file format");
      data._3_1_ = false;
    }
    surface_local._7_1_ = data._3_1_;
  }
  return surface_local._7_1_;
}

Assistant:

GPU_bool GPU_SaveSurface(SDL_Surface* surface, const char* filename, GPU_FileFormatEnum format)
{
    GPU_bool result;
    unsigned char* data;

    if(surface == NULL || filename == NULL ||
            surface->w < 1 || surface->h < 1)
    {
        return GPU_FALSE;
    }


    data = surface->pixels;

    if(format == GPU_FILE_AUTO)
    {
        const char* extension = get_filename_ext(filename);
        if(gpu_strcasecmp(extension, "png") == 0)
            format = GPU_FILE_PNG;
        else if(gpu_strcasecmp(extension, "bmp") == 0)
            format = GPU_FILE_BMP;
        else if(gpu_strcasecmp(extension, "tga") == 0)
            format = GPU_FILE_TGA;
        else
        {
            GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Could not detect output file format from file name");
            return GPU_FALSE;
        }
    }

    switch(format)
    {
    case GPU_FILE_PNG:
        result = (stbi_write_png(filename, surface->w, surface->h, surface->format->BytesPerPixel, (const unsigned char *const)data, 0) > 0);
        break;
    case GPU_FILE_BMP:
        result = (stbi_write_bmp(filename, surface->w, surface->h, surface->format->BytesPerPixel, (void*)data) > 0);
        break;
    case GPU_FILE_TGA:
        result = (stbi_write_tga(filename, surface->w, surface->h, surface->format->BytesPerPixel, (void*)data) > 0);
        break;
    default:
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Unsupported output file format");
        result = GPU_FALSE;
        break;
    }

    return result;
}